

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int table_query(lua_State *L)

{
  ushort uVar1;
  uint uVar2;
  StkId pTVar3;
  lua_CFunction p_Var4;
  long lVar5;
  lua_Integer lVar6;
  char *__assertion;
  uint uVar7;
  long lVar8;
  
  lVar6 = luaL_optinteger(L,2,-1);
  luaL_checktype(L,1,5);
  pTVar3 = L->ci->func;
  if (pTVar3[1].tt_ != 0x8005) {
    __assertion = "(((((L->ci->func + (1))))->tt_) == (((5) | (1 << 15))))";
LAB_00134233:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x342,"int table_query(lua_State *)");
  }
  p_Var4 = pTVar3[1].value_.f;
  if (p_Var4[8] != (_func_int_lua_State_ptr)0x5) {
    __assertion = "((((L->ci->func + (1)))->value_).gc)->tt == 5";
    goto LAB_00134233;
  }
  uVar2 = *(uint *)(p_Var4 + 0xc);
  uVar7 = (uint)lVar6;
  if (uVar7 == 0xffffffff) {
    lua_pushinteger(L,(ulong)uVar2);
    if (*(long *)(p_Var4 + 0x20) == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (lua_Integer)(1 << ((byte)p_Var4[0xb] & 0x1f));
    }
    lua_pushinteger(L,lVar6);
    if (*(long *)(p_Var4 + 0x20) == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = *(long *)(p_Var4 + 0x20) - *(long *)(p_Var4 + 0x18) >> 5;
    }
LAB_001341ff:
    lua_pushinteger(L,lVar6);
  }
  else {
    if (uVar7 < uVar2) {
      lua_pushinteger(L,(long)(int)uVar7);
      pushobject(L,(TValue *)((long)(int)uVar7 * 0x10 + *(long *)(p_Var4 + 0x10)));
    }
    else {
      if (1 << ((byte)p_Var4[0xb] & 0x1f) <= (int)(uVar7 - uVar2)) {
        return 3;
      }
      lVar5 = *(long *)(p_Var4 + 0x18);
      lVar8 = (long)(int)(uVar7 - uVar2) * 0x20;
      if ((*(short *)(lVar5 + 8 + lVar8) == 0) &&
         (uVar1 = *(ushort *)(lVar5 + lVar8 + 0x18), uVar1 != 0 && (uVar1 & 0xf) != 3)) {
        lua_pushstring(L,"<undef>");
      }
      else {
        pushobject(L,(TValue *)(lVar5 + 0x10 + lVar8));
      }
      pushobject(L,(TValue *)(*(long *)(p_Var4 + 0x18) + lVar8));
      lVar6 = (lua_Integer)*(int *)(*(long *)(p_Var4 + 0x18) + 0x1c + lVar8);
      if (lVar6 != 0) goto LAB_001341ff;
    }
    lua_pushnil(L);
  }
  return 3;
}

Assistant:

static int table_query (lua_State *L) {
  const Table *t;
  int i = cast_int(luaL_optinteger(L, 2, -1));
  luaL_checktype(L, 1, LUA_TTABLE);
  t = hvalue(obj_at(L, 1));
  if (i == -1) {
    lua_pushinteger(L, t->sizearray);
    lua_pushinteger(L, allocsizenode(t));
    lua_pushinteger(L, isdummy(t) ? 0 : t->lastfree - t->node);
  }
  else if ((unsigned int)i < t->sizearray) {
    lua_pushinteger(L, i);
    pushobject(L, &t->array[i]);
    lua_pushnil(L);
  }
  else if ((i -= t->sizearray) < sizenode(t)) {
    if (!ttisnil(gval(gnode(t, i))) ||
        ttisnil(gkey(gnode(t, i))) ||
        ttisnumber(gkey(gnode(t, i)))) {
      pushobject(L, gkey(gnode(t, i)));
    }
    else
      lua_pushliteral(L, "<undef>");
    pushobject(L, gval(gnode(t, i)));
    if (gnext(&t->node[i]) != 0)
      lua_pushinteger(L, gnext(&t->node[i]));
    else
      lua_pushnil(L);
  }
  return 3;
}